

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O3

size_t __thiscall
BamTools::Internal::ByteArray::IndexOf(ByteArray *this,char c,size_t from,size_t to)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (to == 0) {
    to = uVar2;
  }
  uVar3 = uVar2;
  uVar4 = from;
  if (from < to) {
    do {
      if (uVar2 <= uVar4) {
        if (from <= uVar2) {
          from = uVar2;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",from,
                   uVar2);
      }
      uVar3 = uVar4;
    } while ((pcVar1[uVar4] != c) && (uVar4 = uVar4 + 1, uVar3 = uVar2, to != uVar4));
  }
  return uVar3;
}

Assistant:

std::size_t ByteArray::IndexOf(const char c, const std::size_t from, const std::size_t to) const
{
    const std::size_t size = ((to == 0) ? m_data.size() : to);
    for (std::size_t i = from; i < size; ++i) {
        if (m_data.at(i) == c) {
            return i;
        }
    }
    return m_data.size();
}